

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O1

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  long *plVar1;
  IRProgram *this_00;
  Report *this_01;
  pointer ppVVar2;
  bool bVar3;
  int iVar4;
  int extraout_EAX;
  ConstantArray *pCVar5;
  ConstantArray *extraout_RAX;
  ConstantArray *extraout_RAX_00;
  ConstantArray *extraout_RAX_01;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> *__range3;
  long lVar6;
  undefined4 in_register_00000034;
  long lVar7;
  pointer ppVVar8;
  long lVar9;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> values;
  Value *element;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> local_78;
  string local_58;
  _Alloc_hider local_38;
  
  lVar7 = CONCAT44(in_register_00000034,__fd);
  local_78.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
  super__Vector_impl_data._M_start = (Value **)0x0;
  local_78.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (Value **)0x0;
  local_78.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Value **)0x0;
  lVar9 = *(long *)(lVar7 + 0x48) - *(long *)(lVar7 + 0x40);
  if (lVar9 != 0) {
    lVar6 = 0;
    do {
      plVar1 = *(long **)(*(long *)(lVar7 + 0x40) + lVar6 * 8);
      (**(code **)(*plVar1 + 0x10))(plVar1,this);
      local_58._M_dataplus._M_p = (pointer)this->result_;
      if (local_78.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_78.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<flow::Value*,std::allocator<flow::Value*>>::
        _M_realloc_insert<flow::Value*const&>
                  ((vector<flow::Value*,std::allocator<flow::Value*>> *)&local_78,
                   (iterator)
                   local_78.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(Value **)&local_58);
      }
      else {
        *local_78.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
         super__Vector_impl_data._M_finish = (Value *)local_58._M_dataplus._M_p;
        local_78.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_78.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      lVar6 = lVar6 + 1;
    } while (lVar9 >> 3 != lVar6);
  }
  bVar3 = isConstant(&local_78);
  if (bVar3) {
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_58._M_string_length = 0;
    local_58.field_2._M_allocated_capacity = 0;
    std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>::reserve
              ((vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)&local_58,
               (long)local_78.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_78.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3);
    ppVVar2 = local_78.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (local_78.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_78.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ppVVar8 = local_78.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        local_38._M_p = (pointer)*ppVVar8;
        std::vector<flow::Constant*,std::allocator<flow::Constant*>>::emplace_back<flow::Constant*>
                  ((vector<flow::Constant*,std::allocator<flow::Constant*>> *)&local_58,
                   (Constant **)&local_38);
        ppVVar8 = ppVVar8 + 1;
      } while (ppVVar8 != ppVVar2);
    }
    this_00 = (this->super_IRBuilder).program_;
    pCVar5 = IRProgram::
             get<flow::ConstantArray,std::vector<flow::Constant*,std::allocator<flow::Constant*>>>
                       (this_00,&this_00->constantArrays_,
                        (vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)&local_58);
    this->result_ = (Value *)pCVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_58._M_dataplus._M_p,
                      local_58.field_2._M_allocated_capacity - (long)local_58._M_dataplus._M_p);
      pCVar5 = extraout_RAX;
    }
  }
  else {
    this_01 = this->report_;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"VariableSym array elements not allowed.","");
    diagnostics::Report::typeError<>(this_01,(SourceLocation *)(lVar7 + 8),&local_58);
    pCVar5 = extraout_RAX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      pCVar5 = extraout_RAX_01;
    }
    this->result_ = (Value *)0x0;
  }
  iVar4 = (int)pCVar5;
  if (local_78.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
      super__Vector_impl_data._M_start != (Value **)0x0) {
    operator_delete(local_78.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar4 = extraout_EAX;
  }
  return iVar4;
}

Assistant:

void IRGenerator::accept(ArrayExpr& arrayExpr) {
  std::vector<Value*> values;
  for (size_t i = 0, e = arrayExpr.values().size(); i != e; ++i) {
    Value* element = codegen(arrayExpr.values()[i].get());
    values.push_back(element);
  }

  if (isConstant(values)) {
    std::vector<Constant*> constants;
    constants.reserve(values.size());
    for (Value* value : values)
      constants.emplace_back(static_cast<Constant*>(value));

    result_ = get(constants);
  } else {
    report_->typeError(arrayExpr.location(), "VariableSym array elements not allowed.");
    result_ = nullptr;
  }
}